

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O3

void kv_get_key_isnull_test(void)

{
  size_t len;
  void *key;
  timeval __test_begin;
  size_t local_28 [2];
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  memleak_start();
  local_28[1] = 0;
  btree_str_kv_get_key(local_28 + 1,(void *)0x0,local_28);
  if (local_28[0] != 0) {
    kv_get_key_isnull_test();
  }
  kv_get_key_isnull_test();
  return;
}

Assistant:

void kv_get_key_isnull_test()
{

    TEST_INIT();
    memleak_start();

    void *key = NULL;
    char *strbuf = NULL;
    size_t len;
    btree_str_kv_get_key(&key, strbuf, &len);

    // check results
    TEST_CHK(len == 0);
    free(key);

    memleak_end();
    TEST_RESULT("kv get key is null test");
}